

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O1

UA_StatusCode
UA_Client_Subscriptions_new
          (UA_Client *client,UA_SubscriptionSettings settings,UA_UInt32 *newSubscriptionId)

{
  UA_Client_Subscription *pUVar1;
  UA_Client_Subscription *pUVar2;
  UA_StatusCode UVar3;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  UA_Double local_e8;
  UA_UInt32 local_e0;
  UA_UInt32 UStack_dc;
  UA_UInt32 local_d8;
  undefined1 local_d4;
  UA_Byte local_d3;
  undefined2 local_d2;
  undefined1 local_d0 [8];
  UA_CreateSubscriptionResponse response;
  
  local_f8 = 0;
  uStack_f0 = 0;
  local_108 = 0;
  uStack_100 = 0;
  local_118 = 0;
  uStack_110 = 0;
  local_128 = 0;
  uStack_120 = 0;
  local_138 = 0;
  uStack_130 = 0;
  local_148 = 0;
  uStack_140 = 0;
  local_158 = 0;
  uStack_150 = 0;
  local_e8 = settings.requestedPublishingInterval;
  local_e0 = settings.requestedLifetimeCount;
  UStack_dc = settings.requestedMaxKeepAliveCount;
  local_d8 = settings.maxNotificationsPerPublish;
  local_d4 = settings.publishingEnabled;
  local_d3 = settings.priority;
  local_d2 = 0;
  __UA_Client_Service(client,&local_158,UA_TYPES + 0x5d,local_d0,UA_TYPES + 0x7a);
  UVar3 = response.responseHeader.timestamp._4_4_;
  if (response.responseHeader.timestamp._4_4_ == 0) {
    pUVar2 = (UA_Client_Subscription *)malloc(0x38);
    if (pUVar2 == (UA_Client_Subscription *)0x0) {
      UVar3 = 0x80030000;
    }
    else {
      (pUVar2->monitoredItems).lh_first = (UA_Client_MonitoredItem *)0x0;
      pUVar2->lifeTime = response.revisedPublishingInterval._0_4_;
      pUVar2->keepAliveCount = response.revisedPublishingInterval._4_4_;
      pUVar2->publishingInterval = (UA_Double)response._136_8_;
      pUVar2->subscriptionID = response.responseHeader.additionalHeader.content._32_4_;
      pUVar2->notificationsPerPublish = settings.maxNotificationsPerPublish;
      pUVar2->priority = (uint)settings.priority;
      pUVar1 = (client->subscriptions).lh_first;
      (pUVar2->listEntry).le_next = pUVar1;
      if (pUVar1 != (UA_Client_Subscription *)0x0) {
        (pUVar1->listEntry).le_prev = (UA_Client_Subscription **)pUVar2;
      }
      (client->subscriptions).lh_first = pUVar2;
      (pUVar2->listEntry).le_prev = &(client->subscriptions).lh_first;
      UVar3 = 0;
      if (newSubscriptionId != (UA_UInt32 *)0x0) {
        *newSubscriptionId = response.responseHeader.additionalHeader.content._32_4_;
      }
    }
  }
  deleteMembers_noInit(local_d0,UA_TYPES + 0x7a);
  memset(local_d0,0,0xa0);
  return UVar3;
}

Assistant:

UA_StatusCode
UA_Client_Subscriptions_new(UA_Client *client, UA_SubscriptionSettings settings,
                            UA_UInt32 *newSubscriptionId) {
    UA_CreateSubscriptionRequest request;
    UA_CreateSubscriptionRequest_init(&request);
    request.requestedPublishingInterval = settings.requestedPublishingInterval;
    request.requestedLifetimeCount = settings.requestedLifetimeCount;
    request.requestedMaxKeepAliveCount = settings.requestedMaxKeepAliveCount;
    request.maxNotificationsPerPublish = settings.maxNotificationsPerPublish;
    request.publishingEnabled = settings.publishingEnabled;
    request.priority = settings.priority;

    UA_CreateSubscriptionResponse response = UA_Client_Service_createSubscription(client, request);
    UA_StatusCode retval = response.responseHeader.serviceResult;
    if(retval != UA_STATUSCODE_GOOD)
        goto cleanup;

    UA_Client_Subscription *newSub = UA_malloc(sizeof(UA_Client_Subscription));
    if(!newSub) {
        retval = UA_STATUSCODE_BADOUTOFMEMORY;
        goto cleanup;
    }

    LIST_INIT(&newSub->monitoredItems);
    newSub->lifeTime = response.revisedLifetimeCount;
    newSub->keepAliveCount = response.revisedMaxKeepAliveCount;
    newSub->publishingInterval = response.revisedPublishingInterval;
    newSub->subscriptionID = response.subscriptionId;
    newSub->notificationsPerPublish = request.maxNotificationsPerPublish;
    newSub->priority = request.priority;
    LIST_INSERT_HEAD(&client->subscriptions, newSub, listEntry);

    if(newSubscriptionId)
        *newSubscriptionId = newSub->subscriptionID;

 cleanup:
    UA_CreateSubscriptionResponse_deleteMembers(&response);
    return retval;
}